

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O1

ASN1_OBJECT * OBJ_dup(ASN1_OBJECT *o)

{
  ASN1_OBJECT *orig_ptr;
  uchar *puVar1;
  char **orig_ptr_00;
  char *pcVar2;
  
  if (o == (ASN1_OBJECT *)0x0) {
    return (ASN1_OBJECT *)0x0;
  }
  if ((o->flags & 1) == 0) {
    return o;
  }
  orig_ptr = ASN1_OBJECT_new();
  if (orig_ptr == (ASN1_OBJECT *)0x0) {
    ERR_put_error(8,0,0xc,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                  ,0x46);
    return (ASN1_OBJECT *)0x0;
  }
  orig_ptr->sn = (char *)0x0;
  orig_ptr->ln = (char **)0x0;
  puVar1 = (uchar *)OPENSSL_memdup(o->data,(long)o->length);
  orig_ptr->data = puVar1;
  if (o->length != 0 && puVar1 == (uchar *)0x0) {
LAB_0019a757:
    orig_ptr_00 = (char **)0x0;
LAB_0019a75a:
    OPENSSL_free(orig_ptr_00);
    OPENSSL_free((void *)0x0);
    OPENSSL_free((void *)0x0);
    OPENSSL_free(orig_ptr);
    return (ASN1_OBJECT *)0x0;
  }
  orig_ptr->length = o->length;
  orig_ptr->nid = o->nid;
  if (o->ln == (char **)0x0) {
    orig_ptr_00 = (char **)0x0;
  }
  else {
    orig_ptr_00 = (char **)OPENSSL_strdup((char *)o->ln);
    if (orig_ptr_00 == (char **)0x0) goto LAB_0019a757;
  }
  if (o->sn == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = OPENSSL_strdup(o->sn);
    if (pcVar2 == (char *)0x0) goto LAB_0019a75a;
  }
  orig_ptr->sn = pcVar2;
  orig_ptr->ln = orig_ptr_00;
  orig_ptr->flags = o->flags | 0xd;
  return orig_ptr;
}

Assistant:

ASN1_OBJECT *OBJ_dup(const ASN1_OBJECT *o) {
  ASN1_OBJECT *r;
  unsigned char *data = NULL;
  char *sn = NULL, *ln = NULL;

  if (o == NULL) {
    return NULL;
  }

  if (!(o->flags & ASN1_OBJECT_FLAG_DYNAMIC)) {
    // TODO(fork): this is a little dangerous.
    return (ASN1_OBJECT *)o;
  }

  r = ASN1_OBJECT_new();
  if (r == NULL) {
    OPENSSL_PUT_ERROR(OBJ, ERR_R_ASN1_LIB);
    return NULL;
  }
  r->ln = r->sn = NULL;

  // once data is attached to an object, it remains const
  r->data = reinterpret_cast<uint8_t *>(OPENSSL_memdup(o->data, o->length));
  if (o->length != 0 && r->data == NULL) {
    goto err;
  }

  r->length = o->length;
  r->nid = o->nid;

  if (o->ln != NULL) {
    ln = OPENSSL_strdup(o->ln);
    if (ln == NULL) {
      goto err;
    }
  }

  if (o->sn != NULL) {
    sn = OPENSSL_strdup(o->sn);
    if (sn == NULL) {
      goto err;
    }
  }

  r->sn = sn;
  r->ln = ln;

  r->flags =
      o->flags | (ASN1_OBJECT_FLAG_DYNAMIC | ASN1_OBJECT_FLAG_DYNAMIC_STRINGS |
                  ASN1_OBJECT_FLAG_DYNAMIC_DATA);
  return r;

err:
  OPENSSL_free(ln);
  OPENSSL_free(sn);
  OPENSSL_free(data);
  OPENSSL_free(r);
  return NULL;
}